

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void __thiscall embree::Tutorial::postParseCommandLine(Tutorial *this)

{
  undefined8 uVar1;
  Application *pAVar2;
  bool bVar3;
  FileName *this_00;
  Application *this_01;
  FileName *in_RDI;
  FileName file;
  SceneLoadingTutorialApplication *in_stack_fffffffffffffe48;
  allocator *paVar4;
  string *in_stack_fffffffffffffe68;
  string *endl;
  FileName *in_stack_fffffffffffffe70;
  string *seps;
  LineCommentFilter *this_02;
  char *in_stack_fffffffffffffe88;
  FileName *in_stack_fffffffffffffea0;
  FileName *in_stack_fffffffffffffea8;
  allocator local_139;
  string local_138 [39];
  undefined1 local_111 [39];
  undefined1 local_ea;
  undefined1 local_e9 [33];
  string local_c8 [4];
  long local_40;
  Application *local_30;
  string *local_28;
  FileName *local_20;
  long local_18;
  Application **local_10;
  
  switch(shader) {
  case SHADER_DEFAULT:
    renderFrame = renderFrameStandard;
    break;
  case SHADER_EYELIGHT:
    renderFrame = renderFrameDebugShader;
    break;
  case SHADER_OCCLUSION:
    renderFrame = renderFrameDebugShader;
    break;
  case SHADER_UV:
    renderFrame = renderFrameDebugShader;
    break;
  case SHADER_TEXCOORDS:
    renderFrame = renderFrameDebugShader;
    break;
  case SHADER_TEXCOORDS_GRID:
    renderFrame = renderFrameDebugShader;
    break;
  case SHADER_NG:
    renderFrame = renderFrameDebugShader;
    break;
  case SHADER_CYCLES:
    renderFrame = renderFrameDebugShader;
    break;
  case SHADER_GEOMID:
    renderFrame = renderFrameDebugShader;
    break;
  case SHADER_GEOMID_PRIMID:
    renderFrame = renderFrameDebugShader;
    break;
  case SHADER_AO:
    renderFrame = renderFrameAOShader;
  }
  bVar3 = SceneLoadingTutorialApplication::scene_empty_post_parse(in_stack_fffffffffffffe48);
  if (bVar3) {
    embree::FileName::executableFolder();
    embree::FileName::FileName(in_RDI,in_stack_fffffffffffffe88);
    embree::FileName::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    embree::FileName::~FileName((FileName *)0x1257b3);
    embree::FileName::~FileName((FileName *)0x1257c0);
    this_00 = (FileName *)::operator_new(0x48);
    this_01 = (Application *)::operator_new(0x68);
    local_ea = 1;
    this_02 = (LineCommentFilter *)local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_e9 + 1),"#",(allocator *)this_02);
    LineCommentFilter::LineCommentFilter
              (this_02,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_ea = 0;
    seps = local_c8;
    local_30 = this_01;
    local_28 = seps;
    pAVar2 = this_01;
    if (this_01 != (Application *)0x0) {
      uVar1 = local_c8[0]._0_8_;
      local_c8[0]._0_8_ = this_01;
      (**(code **)(*(long *)uVar1 + 0x10))();
      pAVar2 = (Application *)local_c8[0]._0_8_;
    }
    local_c8[0]._0_8_ = pAVar2;
    endl = (string *)local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_111 + 1),"\n\t\r ",(allocator *)endl);
    paVar4 = &local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"",paVar4);
    ParseStream::ParseStream
              ((ParseStream *)this_01,(Ref<embree::Stream<int>_> *)this_02,seps,endl,
               SUB81((ulong)paVar4 >> 0x38,0));
    local_18 = (long)&local_c8[0]._M_string_length;
    local_20 = this_00;
    local_c8[0]._M_string_length = (size_type)this_00;
    if (this_00 != (FileName *)0x0) {
      (**(code **)(*(long *)&this_00->filename + 0x10))();
    }
    embree::FileName::path(this_00);
    Application::parseCommandLine(this_01,(Ref<embree::ParseStream> *)this_02,(FileName *)seps);
    embree::FileName::~FileName((FileName *)0x1259a7);
    local_40 = (long)&local_c8[0]._M_string_length;
    if ((FileName *)local_c8[0]._M_string_length != (FileName *)0x0) {
      (**(code **)(*(long *)(string *)local_c8[0]._M_string_length + 0x18))();
    }
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    std::__cxx11::string::~string((string *)(local_111 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_111);
    local_10 = (Application **)local_c8;
    if ((Application *)local_c8[0]._0_8_ != (Application *)0x0) {
      (*(((Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_c8[0]._0_8_)->super_RefCount)._vptr_RefCount[3])();
    }
    std::__cxx11::string::~string((string *)(local_e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_e9);
    embree::FileName::~FileName((FileName *)0x125a82);
  }
  return;
}

Assistant:

void postParseCommandLine() override
    {
      /* set shader mode */
      switch (shader) {
      case SHADER_DEFAULT  : renderFrame = renderFrameStandard; break;
      case SHADER_EYELIGHT : renderFrame = renderFrameDebugShader; break;
      case SHADER_OCCLUSION: renderFrame = renderFrameDebugShader; break;
      case SHADER_UV       : renderFrame = renderFrameDebugShader; break;
      case SHADER_TEXCOORDS: renderFrame = renderFrameDebugShader; break;
      case SHADER_TEXCOORDS_GRID: renderFrame = renderFrameDebugShader; break;
      case SHADER_NG       : renderFrame = renderFrameDebugShader; break;
      case SHADER_CYCLES   : renderFrame = renderFrameDebugShader; break;
      case SHADER_GEOMID   : renderFrame = renderFrameDebugShader; break;
      case SHADER_GEOMID_PRIMID: renderFrame = renderFrameDebugShader; break;
      case SHADER_AO: renderFrame = renderFrameAOShader; break;      
      };
      
      /* load default scene if none specified */
      if (scene_empty_post_parse()) {
        FileName file = FileName::executableFolder() + FileName("models/cornell_box.ecs");
        parseCommandLine(new ParseStream(new LineCommentFilter(file, "#")), file.path());
      }
    }